

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int decodeDpcm(string *in_file_path,uchar *dpcm,int dpcm_frames,int dpcm_initial_volume,
              int bias_level,bool outputToFile,double dst_rate)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  allocator local_91;
  string *local_90;
  double local_88;
  string local_80;
  StkFrames decode_sample;
  
  local_90 = in_file_path;
  local_88 = dst_rate;
  stk::StkFrames::StkFrames(&decode_sample,dpcm_frames,1);
  if (dpcm_frames < 1) {
    dpcm_frames = 0;
  }
  iVar3 = 0;
  for (uVar4 = 0; (uint)dpcm_frames != uVar4; uVar4 = uVar4 + 1) {
    bVar5 = (dpcm[uVar4 >> 3 & 0x1fffffff] & '\x01' << ((byte)uVar4 & 7)) != 0;
    bVar1 = dpcm_initial_volume < 0x7e;
    if (!bVar5) {
      bVar1 = 1 < dpcm_initial_volume;
    }
    iVar2 = (uint)bVar5 * 4 + -2;
    if (!bVar1) {
      iVar2 = 0;
    }
    dpcm_initial_volume = dpcm_initial_volume + iVar2;
    if (iVar3 <= dpcm_initial_volume) {
      iVar3 = dpcm_initial_volume;
    }
    decode_sample.data_[uVar4] =
         (159.79 / (22638.0 / (double)dpcm_initial_volume + 100.0)) / 0.5771522095 -
         (159.79 / (22638.0 / (double)bias_level + 100.0)) / 0.5771522095;
  }
  if (outputToFile) {
    std::__cxx11::string::string((string *)&local_80,"_dpcm",&local_91);
    outputBufferToFile(local_90,&decode_sample,&local_80,local_88);
    std::__cxx11::string::~string((string *)&local_80);
  }
  stk::StkFrames::~StkFrames(&decode_sample);
  return iVar3;
}

Assistant:

int decodeDpcm(const std::string &in_file_path, const unsigned char *dpcm,
			   int dpcm_frames, int dpcm_initial_volume, int bias_level, bool outputToFile,
			   double dst_rate)
{
	int volume_max = 0;
	
	stk::StkFrames decode_sample(dpcm_frames, 1);
	int now_sample = dpcm_initial_volume;
	for (int i=0; i<dpcm_frames; ++i) {
		if (dpcm[i / 8] & dpcmBitMask(i)) {
			if (now_sample <= 125) {
				now_sample += 2;
			}
		}
		else {
			if (now_sample >= 2) {
				now_sample -= 2;
			}
		}
		
		if (volume_max < now_sample) {
			volume_max = now_sample;
		}
		
		// 実機非線形特性
		decode_sample[i] = linearToDacCurve(now_sample) - linearToDacCurve(bias_level);
	}
	if (outputToFile) {
		outputBufferToFile(in_file_path, decode_sample, "_dpcm", dst_rate);
	}
	
	return volume_max;
}